

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void readMessages(void)

{
  int iVar1;
  int __n;
  int __fd;
  function<void_()> local_c0;
  function<void_(unsigned_int,_const_char_*,_unsigned_int)> local_a0;
  undefined1 local_80 [8];
  MessageReceiver rx;
  
  unixsocketipc::MessageReceiver::MessageReceiver((MessageReceiver *)local_80);
  std::function<void(unsigned_int,char_const*,unsigned_int)>::
  function<void(&)(unsigned_int,char_const*,unsigned_int),void>
            ((function<void(unsigned_int,char_const*,unsigned_int)> *)&local_a0,callback);
  std::function<void_()>::function(&local_c0);
  __fd = 0x10503e;
  iVar1 = unixsocketipc::MessageReceiver::init
                    ((MessageReceiver *)local_80,(EVP_PKEY_CTX *)"/tmp/MessageSenderReceiverSocket")
  ;
  std::function<void_()>::~function(&local_c0);
  std::function<void_(unsigned_int,_const_char_*,_unsigned_int)>::~function(&local_a0);
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    printf("reader ready. waiting for connection...\n");
    unixsocketipc::MessageReceiver::listen((MessageReceiver *)local_80,__fd,__n);
  }
  else {
    printf("rx.init failed.\n");
  }
  unixsocketipc::MessageReceiver::~MessageReceiver((MessageReceiver *)local_80);
  return;
}

Assistant:

void readMessages() {
   MessageReceiver rx;
   if (!rx.init("/tmp/MessageSenderReceiverSocket", callback)) {
      printf("rx.init failed.\n");
      return;
   }

   printf("reader ready. waiting for connection...\n");
   rx.listen();
}